

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

CDefineTable * __thiscall CDefineTable::operator=(CDefineTable *this,CDefineTable *defTable)

{
  CDefineTableEntry *local_40;
  CDefineTableEntry *srcD;
  CDefineTableEntry *srcDef;
  CDefineTableEntry **__end1;
  CDefineTableEntry **__begin1;
  CDefineTableEntry *(*__range1) [128];
  CDefineTable *defTable_local;
  CDefineTable *this_local;
  
  RemoveAll(this);
  for (__end1 = defTable->defs; (CDefineTable *)__end1 != defTable + 1; __end1 = __end1 + 1) {
    for (local_40 = *__end1; local_40 != (CDefineTableEntry *)0x0; local_40 = local_40->next) {
      Add(this,local_40->name,local_40->value,local_40->nss);
    }
  }
  return this;
}

Assistant:

CDefineTable& CDefineTable::operator=(CDefineTable const & defTable) {
	RemoveAll();
	for (CDefineTableEntry* srcDef : defTable.defs) {
		CDefineTableEntry* srcD = srcDef;
		while (srcD) {
			Add(srcD->name, srcD->value, srcD->nss);
			srcD = srcD->next;
		}
	}
	return *this;
}